

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall Compiler::writeNBytes(Compiler *this,void *addr,int count)

{
  Error *this_00;
  int local_6c;
  undefined1 *puStack_68;
  int i;
  char *p;
  allocator<char> local_49;
  string local_48;
  undefined1 local_24 [8];
  char bytes [8];
  int count_local;
  void *addr_local;
  Compiler *this_local;
  
  bytes._0_4_ = count;
  unique0x1000011c = addr;
  if ((0 < count) && (count < 9)) {
    puStack_68 = (undefined1 *)((long)addr + (long)(count + -1));
    for (local_6c = 0; local_6c < (int)bytes._0_4_; local_6c = local_6c + 1) {
      local_24[local_6c] = *puStack_68;
      puStack_68 = puStack_68 + -1;
    }
    std::ostream::write((char *)this->_wtr,(long)local_24);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"compiler error",&local_49)
  ;
  Error::Error(this_00,&local_48);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void Compiler::writeNBytes(void* addr, int count) {
	char bytes[8];
	if (!(0 < count && count <= 8)) {
		throw Error("compiler error");
	}
	char* p = reinterpret_cast<char*>(addr) + (count - 1);
	for (int i = 0; i < count; ++i) {
		bytes[i] = *p--;
	}
	_wtr.write(bytes, count);
}